

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int glfwPlatformSupported(int platformID)

{
  ulong local_20;
  size_t i;
  size_t count;
  int platformID_local;
  
  if ((((platformID == 0x60001) || (platformID == 0x60002)) || (platformID == 0x60003)) ||
     ((platformID == 0x60004 || (platformID == 0x60005)))) {
    if (platformID == 0x60005) {
      count._4_4_ = 1;
    }
    else {
      for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
        if (platformID == supportedPlatforms[local_20].ID) {
          return 1;
        }
      }
      count._4_4_ = 0;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid platform ID 0x%08X",(ulong)(uint)platformID);
    count._4_4_ = 0;
  }
  return count._4_4_;
}

Assistant:

GLFWAPI int glfwPlatformSupported(int platformID)
{
    const size_t count = sizeof(supportedPlatforms) / sizeof(supportedPlatforms[0]);
    size_t i;

    if (platformID != GLFW_PLATFORM_WIN32 &&
        platformID != GLFW_PLATFORM_COCOA &&
        platformID != GLFW_PLATFORM_WAYLAND &&
        platformID != GLFW_PLATFORM_X11 &&
        platformID != GLFW_PLATFORM_NULL)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid platform ID 0x%08X", platformID);
        return GLFW_FALSE;
    }

    if (platformID == GLFW_PLATFORM_NULL)
        return GLFW_TRUE;

    for (i = 0;  i < count;  i++)
    {
        if (platformID == supportedPlatforms[i].ID)
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}